

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void print_stats_diff(device_stats *stats_new,device_stats *stats_old,uint64_t nanos)

{
  uint32_t uVar1;
  uint64_t in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint64_t in_stack_ffffffffffffffc8;
  char *pkts_old;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *bytes_new;
  char *bytes_new_00;
  
  if (*in_RDI == 0) {
    bytes_new = "???";
  }
  else {
    bytes_new = *(char **)*in_RDI;
  }
  bytes_new_00 = bytes_new;
  uVar1 = diff_mbit((uint64_t)bytes_new,
                    CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (uint64_t)bytes_new,in_stack_ffffffffffffffc8,
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  diff_mpps(in_RDI[1],*(uint64_t *)(in_RSI + 8),in_RDX);
  printf("[%s] RX: %d Mbit/s %.2f Mpps\n",bytes_new,(ulong)uVar1);
  if (*in_RDI == 0) {
    pkts_old = "???";
  }
  else {
    pkts_old = *(char **)*in_RDI;
  }
  uVar1 = diff_mbit((uint64_t)bytes_new_00,CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                    (uint64_t)bytes_new,(uint64_t)pkts_old,
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  diff_mpps(in_RDI[2],*(uint64_t *)(in_RSI + 0x10),in_RDX);
  printf("[%s] TX: %d Mbit/s %.2f Mpps\n",pkts_old,(ulong)uVar1);
  return;
}

Assistant:

void print_stats_diff(struct device_stats* stats_new, struct device_stats* stats_old, uint64_t nanos) {
	printf("[%s] RX: %d Mbit/s %.2f Mpps\n", stats_new->device ? stats_new->device->pci_addr : "???",
		diff_mbit(stats_new->rx_bytes, stats_old->rx_bytes, stats_new->rx_pkts, stats_old->rx_pkts, nanos),
		diff_mpps(stats_new->rx_pkts, stats_old->rx_pkts, nanos)
	);
	printf("[%s] TX: %d Mbit/s %.2f Mpps\n", stats_new->device ? stats_new->device->pci_addr : "???",
		diff_mbit(stats_new->tx_bytes, stats_old->tx_bytes, stats_new->tx_pkts, stats_old->tx_pkts, nanos),
		diff_mpps(stats_new->tx_pkts, stats_old->tx_pkts, nanos)
	);
}